

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O1

string * Game::Graphics::YouWinPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream win_richtext;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  poVar1 = Color::operator<<((ostream *)aoStack_188,&green);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"You win! Congratulations!",0x19);
  poVar1 = Color::operator<<(poVar1,&def);
  poVar1 = Color::operator<<(poVar1,&bold_off);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return in_RDI;
}

Assistant:

std::string YouWinPrompt() {
  constexpr auto win_game_text = "You win! Congratulations!";
  constexpr auto sp = "  ";
  std::ostringstream win_richtext;
  win_richtext << green << bold_on << sp << win_game_text << def << bold_off
               << "\n\n\n";
  return win_richtext.str();
}